

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ufs.c
# Opt level: O1

LispPTR UFS_directorynamep(LispPTR *args)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  undefined4 extraout_var;
  int *piVar7;
  size_t sVar8;
  DLword *pDVar9;
  char *pcVar10;
  long lVar11;
  stat sbuf;
  char dirname [4096];
  char fullname [4096];
  stat sStack_20c8;
  char local_2038 [4096];
  char local_1038 [4104];
  
  iVar4 = _setjmp((__jmp_buf_tag *)jmpbuf);
  if (iVar4 == 0) {
    uVar2 = args[2];
    if ((uVar2 & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar2);
    }
    Lisp_errno = (int *)(Lisp_world + uVar2);
    uVar2 = *args;
    if ((uVar2 & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar2);
    }
    if ((char)Lisp_world[(ulong)uVar2 + 3] == 'D') {
      lVar6 = (long)*(int *)(Lisp_world + (ulong)uVar2 + 4) * 2;
    }
    else if ((char)Lisp_world[(ulong)uVar2 + 3] == 'C') {
      lVar6 = (long)*(int *)(Lisp_world + (ulong)uVar2 + 4);
    }
    else {
      iVar4 = error("LispStringLength: Not a character array.\n");
      lVar6 = CONCAT44(extraout_var,iVar4);
    }
    if (0xfffffffffffff000 < lVar6 - 0xffeU) {
      uVar2 = *args;
      if ((uVar2 & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar2);
      }
      iVar4 = *(int *)(Lisp_world + (ulong)uVar2 + 4);
      iVar5 = 0x1000;
      if (iVar4 < 0x1000) {
        iVar5 = iVar4;
      }
      lVar6 = (long)iVar5;
      if ((char)Lisp_world[(ulong)uVar2 + 3] == 'D') {
        if (iVar4 == 0) {
          pcVar10 = local_2038;
        }
        else {
          lVar6 = lVar6 + (ulong)(lVar6 == 0);
          pDVar9 = Lisp_world +
                   (ulong)Lisp_world[(ulong)uVar2 + 2] +
                   (ulong)(*(uint *)(Lisp_world + uVar2) & 0xfffffff);
          pcVar10 = local_2038;
          do {
            *pcVar10 = *(char *)((ulong)pDVar9 ^ 2);
            pcVar10 = pcVar10 + 1;
            pDVar9 = pDVar9 + 1;
            lVar6 = lVar6 + -1;
          } while (lVar6 != 0);
        }
        *pcVar10 = '\0';
      }
      else if ((char)Lisp_world[(ulong)uVar2 + 3] == 'C') {
        if (iVar4 != 0) {
          uVar3 = *(uint *)(Lisp_world + uVar2);
          uVar1 = Lisp_world[(ulong)uVar2 + 2];
          lVar11 = 0;
          do {
            local_2038[lVar11] =
                 *(char *)((long)Lisp_world + lVar11 + (ulong)uVar1 + (ulong)(uVar3 & 0xfffffff) * 2
                          ^ 3);
            lVar11 = lVar11 + 1;
          } while (lVar6 + (ulong)(lVar6 == 0) != lVar11);
        }
        local_2038[lVar6] = '\0';
      }
      else {
        error("LispStringToCString: Not a character array.\n");
      }
      iVar4 = unixpathname(local_2038,local_1038,0,0);
      if (iVar4 == 0) {
        return 0;
      }
      alarm(TIMEOUT_TIME);
      piVar7 = __errno_location();
      do {
        *piVar7 = 0;
        iVar4 = stat(local_1038,&sStack_20c8);
        if (iVar4 != -1) {
          alarm(0);
          if ((sStack_20c8.st_mode & 0xf000) != 0x4000) {
            return 0;
          }
          lisppathname(local_1038,local_2038,1,0);
          sVar8 = strlen(local_2038);
          uVar2 = args[1];
          if ((uVar2 & 1) != 0) {
            printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar2);
          }
          pDVar9 = Lisp_world;
          if (sVar8 != 0xffffffffffffffff) {
            uVar2 = *(uint *)(Lisp_world + uVar2);
            lVar6 = 0;
            do {
              *(char *)((long)pDVar9 + lVar6 + (ulong)(uVar2 & 0xfffffff) * 2 ^ 3) =
                   local_2038[lVar6];
              lVar6 = lVar6 + 1;
            } while (sVar8 + 1 != lVar6);
          }
          if ((long)sVar8 < 0) {
            if (-0x10001 < (long)sVar8) {
              return (uint)sVar8 & 0xffff | 0xf0000;
            }
          }
          else if ((long)sVar8 < 0x10000) {
            return (uint)sVar8 | 0xe0000;
          }
          error("Not Smallp data");
          return 0xe0000;
        }
      } while (*piVar7 == 4);
      alarm(0);
      *Lisp_errno = *piVar7;
      return 0;
    }
    *Lisp_errno = 200;
  }
  else {
    *Lisp_errno = 100;
  }
  return 0;
}

Assistant:

LispPTR UFS_directorynamep(LispPTR *args)
{
  char dirname[MAXPATHLEN];
  char fullname[MAXPATHLEN];
  size_t len;
  int rval;
  char *base;
  struct stat sbuf;

  ERRSETJMP(NIL);
  Lisp_errno = (int *)(NativeAligned4FromLAddr(args[2]));

  LispStringLength(args[0], len, rval);
  len += 1;
  /* -2 for the initial and trail directory delimiter. */
  if (len > MAXPATHLEN - 2) FileNameTooLong(NIL);

  LispStringToCString(args[0], dirname, MAXPATHLEN);

/* Convert Xerox Lisp file naming convention to Unix one. */
#ifdef DOS
  if (unixpathname(dirname, fullname, 0, 0, 0, 0, 0) == 0) return (NIL);
#else
  if (unixpathname(dirname, fullname, 0, 0) == 0) return (NIL);
#endif /* DOS */

  TIMEOUT(rval = stat(fullname, &sbuf));
  if (rval == -1) {
    *Lisp_errno = errno;
    return (NIL);
  }

  if (!S_ISDIR(sbuf.st_mode)) return (NIL);

  /* Convert Unix file naming convention to Xerox Lisp one. */
  if (lisppathname(fullname, dirname, 1, 0) == 0) return (NIL);

  len = strlen(dirname);
  STRING_BASE(args[1], base);

#ifndef BYTESWAP
  strncpy(base, dirname, len + 1);
#else
  StrNCpyFromCToLisp(base, dirname, len + 1);
#endif /* BYTESWAP */

  return (GetSmallp(len));
}